

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O0

int binbuf_nextmess(int argc,t_atom *argv)

{
  int iVar1;
  int local_1c;
  t_atom *ptStack_18;
  int i;
  t_atom *argv_local;
  int argc_local;
  
  local_1c = 0;
  iVar1 = local_1c;
  ptStack_18 = argv;
  argv_local._0_4_ = argc;
  do {
    local_1c = iVar1;
    if ((int)argv_local == 0) {
      return local_1c;
    }
    ptStack_18 = ptStack_18 + 1;
    iVar1 = local_1c + 1;
    argv_local._0_4_ = (int)argv_local + -1;
  } while (ptStack_18->a_type != A_SEMI);
  return local_1c + 2;
}

Assistant:

static int binbuf_nextmess(int argc, const t_atom *argv)
{
    int i=0;
    while(argc--)
    {
        argv++;
        i++;
        if (A_SEMI == argv->a_type) {
            return i+1;
        }
    }
    return i;
}